

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Serializer.cpp
# Opt level: O2

BP5WriterRec __thiscall
adios2::format::BP5Serializer::CreateWriterRec
          (BP5Serializer *this,void *Variable,char *Name,DataType Type,size_t ElemSize,
          size_t DimCount)

{
  void *pvVar1;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_true>
  _Var2;
  DataType DVar3;
  int iVar4;
  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_false,_true>
  _Var5;
  size_t sVar6;
  FMFieldList p_Var7;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  FMFormat p_Var11;
  size_t sVar12;
  BP5Serializer *pBVar13;
  long lVar14;
  char *__format;
  int i;
  uint ElementSize;
  undefined8 *puVar15;
  FMStructDescRec *pFVar16;
  BP5Serializer *pBVar17;
  ulong uVar18;
  int *piVar19;
  bool bVar20;
  byte bVar21;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_false,_true>,_bool>
  pVar22;
  char *local_128;
  int IDLength;
  void *local_f0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_true>
  local_e8;
  size_t local_e0;
  FMStructDescRec struct_list [4];
  FMFormat Format;
  
  bVar21 = 0;
  std::__cxx11::string::string((string *)struct_list,(string *)((long)Variable + 8));
  struct_list[2].format_name = (char *)0x0;
  struct_list[2].field_list = (FMFieldList)0x0;
  struct_list[1].struct_size = 0;
  struct_list[1]._20_4_ = 0;
  struct_list[1].opt_info = (FMOptInfo *)0x0;
  struct_list[1].format_name = (char *)0x0;
  struct_list[1].field_list = (FMFieldList)0x0;
  struct_list[2].struct_size = 0;
  struct_list[2]._20_4_ = 0;
  pVar22 = std::
           _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,adios2::format::BP5Serializer::_BP5WriterRec>,std::allocator<std::pair<std::__cxx11::string_const,adios2::format::BP5Serializer::_BP5WriterRec>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
           ::
           _M_emplace<std::pair<std::__cxx11::string,adios2::format::BP5Serializer::_BP5WriterRec>>
                     ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,adios2::format::BP5Serializer::_BP5WriterRec>,std::allocator<std::pair<std::__cxx11::string_const,adios2::format::BP5Serializer::_BP5WriterRec>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                       *)&(this->Info).RecNameMap,struct_list);
  _Var5 = pVar22.first.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_true>
          ._M_cur;
  pBVar13 = (BP5Serializer *)struct_list;
  std::__cxx11::string::~string((string *)pBVar13);
  if (Type == String) {
    ElemSize = 8;
  }
  *(void **)((long)_Var5.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_true>
                   ._M_cur + 0x28) = Variable;
  *(undefined4 *)
   ((long)_Var5.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_true>
          ._M_cur + 0x34) = *(undefined4 *)((long)Variable + 0x40);
  *(int *)((long)_Var5.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_true>
                 ._M_cur + 0x30) = (this->Info).RecCount;
  *(int *)((long)_Var5.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_true>
                 ._M_cur + 0x50) = (int)DimCount;
  *(DataType *)
   ((long)_Var5.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_true>
          ._M_cur + 0x54) = Type;
  *(undefined8 *)
   ((long)_Var5.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_true>
          ._M_cur + 0x48) = 0;
  local_f0 = Variable;
  local_e8 = _Var5.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_true>
             ._M_cur;
  if (Type == Struct) {
    pBVar13 = *(BP5Serializer **)((long)Variable + 0x248);
    if (pBVar13 == (BP5Serializer *)0x0) {
      pBVar13 = *(BP5Serializer **)((long)Variable + 0x240);
    }
    local_e0 = DimCount;
    sVar6 = core::StructDefinition::Fields((StructDefinition *)pBVar13);
    p_Var7 = (FMFieldList)malloc(sVar6 * 0x18 + 0x18);
    piVar19 = &p_Var7->field_offset;
    uVar18 = 0;
    while( true ) {
      sVar6 = core::StructDefinition::Fields((StructDefinition *)pBVar13);
      if (sVar6 <= uVar18) break;
      core::StructDefinition::Name_abi_cxx11_
                ((string *)struct_list,(StructDefinition *)pBVar13,uVar18);
      pcVar8 = strdup(struct_list[0].format_name);
      ((_FMField *)(piVar19 + -5))->field_name = pcVar8;
      std::__cxx11::string::~string((string *)struct_list);
      pBVar17 = pBVar13;
      DVar3 = core::StructDefinition::Type((StructDefinition *)pBVar13,uVar18);
      pcVar8 = TranslateADIOS2Type2FFS(pBVar17,DVar3);
      *(char **)(piVar19 + -3) = pcVar8;
      DVar3 = core::StructDefinition::Type((StructDefinition *)pBVar13,uVar18);
      iVar4 = TypeElementSize(DVar3);
      piVar19[-1] = iVar4;
      sVar6 = core::StructDefinition::Offset((StructDefinition *)pBVar13,uVar18);
      *piVar19 = (int)sVar6;
      sVar6 = core::StructDefinition::ElementCount((StructDefinition *)pBVar13,uVar18);
      if (sVar6 != 1) {
        sVar9 = strlen(pcVar8);
        pcVar10 = (char *)malloc(sVar9 + 10);
        core::StructDefinition::ElementCount((StructDefinition *)pBVar13,uVar18);
        snprintf(pcVar10,sVar9 + 10,"%s[%d]",pcVar8);
        free(pcVar8);
        *(char **)(piVar19 + -3) = pcVar10;
      }
      uVar18 = uVar18 + 1;
      piVar19 = piVar19 + 6;
    }
    sVar6 = core::StructDefinition::Fields((StructDefinition *)pBVar13);
    p_Var7[sVar6].field_size = 0;
    p_Var7[sVar6].field_offset = 0;
    p_Var7[sVar6].field_name = (char *)0x0;
    p_Var7[sVar6].field_type = (char *)0x0;
    puVar15 = &DAT_00822e80;
    pFVar16 = struct_list;
    for (lVar14 = 0x10; lVar14 != 0; lVar14 = lVar14 + -1) {
      pFVar16->format_name = (char *)*puVar15;
      puVar15 = puVar15 + (ulong)bVar21 * -2 + 1;
      pFVar16 = (FMStructDescRec *)((long)pFVar16 + (ulong)bVar21 * -0x10 + 8);
    }
    core::StructDefinition::StructName_abi_cxx11_((string *)&Format,(StructDefinition *)pBVar13);
    struct_list[0].format_name = strdup((char *)Format);
    std::__cxx11::string::~string((string *)&Format);
    struct_list[0].field_list = p_Var7;
    sVar6 = core::StructDefinition::StructSize((StructDefinition *)pBVar13);
    struct_list[0].struct_size = (int)sVar6;
    p_Var11 = (FMFormat)register_data_format((this->Info).LocalFMContext,struct_list);
    Format = p_Var11;
    free_FMfield_list(p_Var7);
    free(struct_list[0].format_name);
    get_server_ID_FMformat(p_Var11,&IDLength);
    uVar18 = (ulong)IDLength;
    pcVar8 = (char *)malloc(uVar18 * 2 + 1);
    pcVar10 = pcVar8;
    for (lVar14 = 0; lVar14 < (int)uVar18; lVar14 = lVar14 + 1) {
      snprintf(pcVar10,3,"%02x");
      uVar18 = (ulong)(uint)IDLength;
      pcVar10 = pcVar10 + 2;
    }
    pBVar13 = (BP5Serializer *)&this->NewStructFormats;
    std::vector<_FMFormatBody_*,_std::allocator<_FMFormatBody_*>_>::push_back
              ((vector<_FMFormatBody_*,_std::allocator<_FMFormatBody_*>_> *)pBVar13,&Format);
    DimCount = local_e0;
  }
  else {
    pcVar8 = (char *)0x0;
  }
  _Var2._M_cur = local_e8._M_cur;
  pvVar1 = local_f0;
  if (DimCount == 0) {
    pcVar10 = BuildVarName(pBVar13,Name,*(ShapeID *)((long)local_f0 + 0x40),0,0);
    AddField(pBVar13,&(this->Info).MetaFields,&(this->Info).MetaFieldCount,pcVar10,Type,
             (int)ElemSize);
    free(pcVar10);
    RecalcMarshalStorageSize(this);
    *(long *)((long)&((_Var2._M_cur)->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>_>
                     ._M_storage._M_storage + 0x38) =
         (long)(this->Info).MetaFields[(long)(this->Info).MetaFieldCount + -1].field_offset;
    *(undefined8 *)
     ((long)&((_Var2._M_cur)->
             super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_true>
             ).
             super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>_>
             ._M_storage._M_storage + 0x30) = 0xffffffffffffffff;
  }
  else {
    if (*(long **)((long)local_f0 + 0xe0) == *(long **)((long)local_f0 + 0xd8)) {
      local_128 = (char *)0x0;
    }
    else {
      local_128 = strdup(*(char **)(**(long **)((long)local_f0 + 0xd8) + 8));
    }
    pcVar10 = NamePrefix(*(ShapeID *)((long)pvVar1 + 0x40));
    if (pcVar8 == (char *)0x0) {
      lVar14 = 0x13;
    }
    else {
      sVar9 = strlen(pcVar8);
      lVar14 = sVar9 + 0x13;
    }
    sVar9 = strlen(Name);
    sVar12 = strlen(pcVar10);
    sVar12 = sVar9 + lVar14 + sVar12;
    pBVar13 = (BP5Serializer *)malloc(sVar12);
    if (pcVar8 == (char *)0x0) {
      __format = "%s%s%zd_%d";
    }
    else {
      __format = "%s%s%zd_%d_%s";
    }
    snprintf((char *)pBVar13,sVar12,__format,pcVar10,"_",ElemSize,(ulong)Type);
    sVar9 = strlen((char *)pBVar13);
    pcVar10 = (char *)((long)&pBVar13->_vptr_BP5Serializer + sVar9);
    pcVar10[0] = '_';
    pcVar10[1] = '\0';
    pBVar17 = pBVar13;
    strcat((char *)pBVar13,Name);
    _Var2._M_cur = local_e8._M_cur;
    bVar20 = *(long *)((long)local_f0 + 0xe0) != *(long *)((long)local_f0 + 0xd8);
    pcVar10 = "MetaArrayOp";
    if (!bVar20) {
      pcVar10 = "MetaArray";
    }
    iVar4 = (uint)bVar20 * 8;
    ElementSize = iVar4 + 0x38;
    if (0 < this->m_StatsLevel) {
      pBVar17 = (BP5Serializer *)struct_list;
      struct_list[0].struct_size = 0;
      struct_list[0]._20_4_ = 0;
      struct_list[0].opt_info = (FMOptInfo *)0x0;
      struct_list[0].format_name = (char *)0x0;
      struct_list[0].field_list = (FMFieldList)0x0;
      struct_list[1].format_name = (char *)0x0;
      strcat((char *)pBVar17,pcVar10);
      switch(ElemSize) {
      case 1:
        pBVar17 = (BP5Serializer *)struct_list;
        sVar9 = strlen((char *)pBVar17);
        *(undefined4 *)((long)&struct_list[0].format_name + sVar9) = 0x314d4d;
        break;
      case 2:
        pBVar17 = (BP5Serializer *)struct_list;
        sVar9 = strlen((char *)pBVar17);
        *(undefined4 *)((long)&struct_list[0].format_name + sVar9) = 0x324d4d;
        break;
      case 3:
      case 5:
      case 6:
      case 7:
        break;
      case 4:
        pBVar17 = (BP5Serializer *)struct_list;
        sVar9 = strlen((char *)pBVar17);
        *(undefined4 *)((long)&struct_list[0].format_name + sVar9) = 0x344d4d;
        break;
      case 8:
        pBVar17 = (BP5Serializer *)struct_list;
        sVar9 = strlen((char *)pBVar17);
        *(undefined4 *)((long)&struct_list[0].format_name + sVar9) = 0x384d4d;
        break;
      default:
        if (ElemSize == 0x10) {
          pBVar17 = (BP5Serializer *)struct_list;
          sVar9 = strlen((char *)pBVar17);
          *(undefined4 *)((long)&struct_list[0].format_name + sVar9) = 0x36314d4d;
          *(undefined1 *)((long)&struct_list[0].format_name + sVar9 + 4) = 0;
        }
      }
      *(ulong *)((long)&((_Var2._M_cur)->
                        super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_true>
                        ).
                        super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>_>
                        ._M_storage._M_storage + 0x50) = (ulong)ElementSize;
      ElementSize = iVar4 + 0x40;
      pcVar10 = (char *)struct_list;
    }
    AddSimpleField(pBVar17,&(this->Info).MetaFields,&(this->Info).MetaFieldCount,(char *)pBVar13,
                   pcVar10,ElementSize);
    *(long *)((long)&((_Var2._M_cur)->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>_>
                     ._M_storage._M_storage + 0x38) =
         (long)(this->Info).MetaFields[(long)(this->Info).MetaFieldCount + -1].field_offset;
    *(char **)((long)&((_Var2._M_cur)->
                      super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_true>
                      ).
                      super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>_>
                      ._M_storage._M_storage + 0x40) = local_128;
    free(pBVar13);
    RecalcMarshalStorageSize(this);
  }
  (this->Info).MetaFormat = (FMFormat)0x0;
  free(pcVar8);
  (this->Info).RecCount = (this->Info).RecCount + 1;
  return (BP5WriterRec)
         ((long)_Var5.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_true>
                ._M_cur + 0x28);
}

Assistant:

BP5Serializer::BP5WriterRec BP5Serializer::CreateWriterRec(void *Variable, const char *Name,
                                                           DataType Type, size_t ElemSize,
                                                           size_t DimCount)
{
    core::VariableBase *VB = static_cast<core::VariableBase *>(Variable);
#ifdef ADIOS2_HAVE_DERIVED_VARIABLE
    core::VariableDerived *VD = dynamic_cast<core::VariableDerived *>(VB);
#endif
    auto obj = Info.RecNameMap.insert(std::make_pair(VB->m_Name, _BP5WriterRec()));
    BP5WriterRec Rec = &obj.first->second;
    if (Type == DataType::String)
        ElemSize = sizeof(char *);
    Rec->Key = Variable;
    Rec->Shape = VB->m_ShapeID;
    Rec->FieldID = Info.RecCount;
    Rec->DimCount = (int)DimCount;
    Rec->Type = (int)Type;
    Rec->OperatorType = NULL;
    char *TextStructID = NULL;
    if (Type == DataType::Struct)
    {
        core::VariableStruct *VS = static_cast<core::VariableStruct *>(Variable);
        core::StructDefinition *SD = VS->m_WriteStructDefinition;
        if (VS->m_ReadStructDefinition)
            SD = VS->m_ReadStructDefinition; // Data has been converted to this
        FMField *List = (FMField *)malloc((SD->Fields() + 1) * sizeof(List[0]));
        for (size_t i = 0; i < SD->Fields(); i++)
        {
            List[i].field_name = strdup(SD->Name(i).c_str());
            List[i].field_type = TranslateADIOS2Type2FFS(SD->Type(i));
            List[i].field_size = TypeElementSize(SD->Type(i));
            List[i].field_offset = (int)SD->Offset(i);
            if (SD->ElementCount(i) != 1)
            {
                size_t Len = strlen(List[i].field_type) + 10;
                char *Tmp = (char *)malloc(Len);
                snprintf(Tmp, Len, "%s[%d]", List[i].field_type, (int)SD->ElementCount(i));
                free((void *)List[i].field_type);
                List[i].field_type = Tmp;
            }
        }
        List[SD->Fields()] = {NULL, NULL, 0, 0};

        FMStructDescRec struct_list[4] = {
            {NULL, NULL, 0, NULL},
            {"complex4", fcomplex_field_list, sizeof(fcomplex_struct), NULL},
            {"complex8", dcomplex_field_list, sizeof(dcomplex_struct), NULL},
            {NULL, NULL, 0, NULL}};
        struct_list[0].format_name = strdup(SD->StructName().c_str());
        struct_list[0].field_list = List;
        struct_list[0].struct_size = (int)SD->StructSize();

        FMFormat Format = register_data_format(Info.LocalFMContext, &struct_list[0]);
        free_FMfield_list(List);
        free((void *)struct_list[0].format_name);

        int IDLength;
        char *ServerID = get_server_ID_FMformat(Format, &IDLength);
        TextStructID = (char *)malloc(IDLength * 2 + 1);
        for (int i = 0; i < IDLength; i++)
        {
            snprintf(&TextStructID[i * 2], 3, "%02x", ((unsigned char *)ServerID)[i]);
        }
        NewStructFormats.push_back(Format);
    }
    if (DimCount == 0)
    {
        // simple field, only add base value FMField to metadata
        char *SstName = BuildVarName(Name, VB->m_ShapeID, 0,
                                     0); // size and type in full field spec
        AddField(&Info.MetaFields, &Info.MetaFieldCount, SstName, Type, (int)ElemSize);
        free(SstName);
        RecalcMarshalStorageSize();
        Rec->MetaOffset = Info.MetaFields[Info.MetaFieldCount - 1].field_offset;
        Rec->DataOffset = (size_t)-1;
        // Changing the formats renders these invalid
        Info.MetaFormat = NULL;
    }
    else
    {
        char *OperatorType = NULL;
        if (VB->m_Operations.size())
        {
            OperatorType = strdup((VB->m_Operations[0])->m_TypeString.data());
        }
        // Array field.  To Metadata, add FMFields for DimCount, Shape, Count
        // and Offsets matching _MetaArrayRec
        const char *ExprString = NULL;
        bool NeverMinMax = false;
#ifdef ADIOS2_HAVE_DERIVED_VARIABLE
        if (VD && (VD->GetDerivedType() != DerivedVarType::StoreData))
            ExprString = VD->m_Expr.ExprString.c_str();
        if (VD && (VD->GetDerivedType() == DerivedVarType::ExpressionString))
            NeverMinMax = true;
#endif
        char *LongName =
            BuildLongName(Name, VB->m_ShapeID, (int)Type, ElemSize, TextStructID, ExprString);

        const char *ArrayTypeName = "MetaArray";
        int FieldSize = sizeof(MetaArrayRec);
        if (VB->m_Operations.size())
        {
            ArrayTypeName = "MetaArrayOp";
            FieldSize = sizeof(MetaArrayRecOperator);
        }
        if ((m_StatsLevel > 0) && !NeverMinMax)
        {
            char MMArrayName[40] = {0};
            strcat(MMArrayName, ArrayTypeName);
            switch (ElemSize)
            {
            case 1:
                strcat(MMArrayName, "MM1");
                break;
            case 2:
                strcat(MMArrayName, "MM2");
                break;
            case 4:
                strcat(MMArrayName, "MM4");
                break;
            case 8:
                strcat(MMArrayName, "MM8");
                break;
            case 16:
                strcat(MMArrayName, "MM16");
                break;
            }
            Rec->MinMaxOffset = FieldSize;
            FieldSize += sizeof(char *);
            AddSimpleField(&Info.MetaFields, &Info.MetaFieldCount, LongName, MMArrayName,
                           FieldSize);
        }
        else
        {
            AddSimpleField(&Info.MetaFields, &Info.MetaFieldCount, LongName, ArrayTypeName,
                           FieldSize);
        }
        Rec->MetaOffset = Info.MetaFields[Info.MetaFieldCount - 1].field_offset;
        Rec->OperatorType = OperatorType;
        free(LongName);
        RecalcMarshalStorageSize();

        // Changing the formats renders these invalid
        Info.MetaFormat = NULL;
    }
    if (TextStructID)
        free((void *)TextStructID);
    Info.RecCount++;
    return Rec;
}